

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall
ON_SubD::SetFragmentColorsFromCallback
          (ON_SubD *this,bool bLazySet,ON_SHA1_Hash fragment_colors_settings_hash,
          ON_MappingTag fragment_colors_mapping_tag,ON__UINT_PTR callback_context,
          _func_ON_Color_ON__UINT_PTR_ON_MappingTag_ptr_ON_SubD_ptr_ON_SubDComponentPtr_ON_3dPoint_ptr_ON_3dVector_ptr_ON_3dPoint_ptr_ON_SurfaceCurvature_ptr
          *color_callback)

{
  ON_SHA1_Hash hash;
  bool bVar1;
  bool bVar2;
  bool local_1c9;
  bool b;
  ON_SubDMeshFragment *local_178;
  ON_SubDMeshFragment *frag;
  ON_SubDMeshFragmentIterator fragit;
  ON_SubDimple *subdimple;
  undefined1 local_e0 [7];
  bool bFragmentVetexColorsSet;
  ON_SHA1_Hash local_44;
  _func_ON_Color_ON__UINT_PTR_ON_MappingTag_ptr_ON_SubD_ptr_ON_SubDComponentPtr_ON_3dPoint_ptr_ON_3dVector_ptr_ON_3dPoint_ptr_ON_SurfaceCurvature_ptr
  *local_30;
  _func_ON_Color_ON__UINT_PTR_ON_MappingTag_ptr_ON_SubD_ptr_ON_SubDComponentPtr_ON_3dPoint_ptr_ON_3dVector_ptr_ON_3dPoint_ptr_ON_SurfaceCurvature_ptr
  *color_callback_local;
  ON__UINT_PTR callback_context_local;
  ON_SubD *pOStack_18;
  bool bLazySet_local;
  ON_SubD *this_local;
  
  local_1c9 = false;
  local_30 = color_callback;
  color_callback_local =
       (_func_ON_Color_ON__UINT_PTR_ON_MappingTag_ptr_ON_SubD_ptr_ON_SubDComponentPtr_ON_3dPoint_ptr_ON_3dVector_ptr_ON_3dPoint_ptr_ON_SurfaceCurvature_ptr
        *)callback_context;
  callback_context_local._7_1_ = bLazySet;
  pOStack_18 = this;
  if (bLazySet) {
    FragmentColorsSettingsHash(&local_44,this);
    bVar1 = ::operator==(&fragment_colors_settings_hash,&local_44);
    local_1c9 = false;
    if (bVar1) {
      ColorsMappingTag((ON_MappingTag *)local_e0,this);
      bVar1 = ::operator==(&fragment_colors_mapping_tag,(ON_MappingTag *)local_e0);
      local_1c9 = false;
      if (bVar1) {
        local_1c9 = HasFragmentColors(this);
      }
    }
  }
  if (local_1c9 == false) {
    bVar1 = false;
    fragit._120_8_ = SubDimple(this);
    this_local._7_1_ = bVar1;
    if ((ON_SubDimple *)fragit._120_8_ != (ON_SubDimple *)0x0) {
      ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator
                ((ON_SubDMeshFragmentIterator *)&frag,this);
      local_178 = ON_SubDMeshFragmentIterator::FirstFragment((ON_SubDMeshFragmentIterator *)&frag);
      while (local_178 != (ON_SubDMeshFragment *)0x0) {
        bVar2 = ON_SubDMeshFragment::SetColorsFromCallback
                          (local_178,&fragment_colors_mapping_tag,this,
                           (ON__UINT_PTR)color_callback_local,local_30);
        if (bVar2) {
          bVar1 = true;
          ON_SubDMeshFragment::SetColorsExistForExperts(local_178,true);
        }
        else {
          ON_SubDMeshFragment::SetColorsExistForExperts(local_178,false);
        }
        local_178 = ON_SubDMeshFragmentIterator::NextFragment((ON_SubDMeshFragmentIterator *)&frag);
      }
      if (bVar1) {
        ON_SubDimple::Internal_SetFragmentColorsSettingsHash
                  ((ON_SubDimple *)fragit._120_8_,fragment_colors_settings_hash);
        SetColorsMappingTag(this,&fragment_colors_mapping_tag);
        ChangeRenderContentSerialNumber(this);
      }
      else {
        hash.m_digest[8] = ON_SHA1_Hash::EmptyContentHash.m_digest[8];
        hash.m_digest[9] = ON_SHA1_Hash::EmptyContentHash.m_digest[9];
        hash.m_digest[10] = ON_SHA1_Hash::EmptyContentHash.m_digest[10];
        hash.m_digest[0xb] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xb];
        hash.m_digest[0xc] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xc];
        hash.m_digest[0xd] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xd];
        hash.m_digest[0xe] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xe];
        hash.m_digest[0xf] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xf];
        hash.m_digest[0] = ON_SHA1_Hash::EmptyContentHash.m_digest[0];
        hash.m_digest[1] = ON_SHA1_Hash::EmptyContentHash.m_digest[1];
        hash.m_digest[2] = ON_SHA1_Hash::EmptyContentHash.m_digest[2];
        hash.m_digest[3] = ON_SHA1_Hash::EmptyContentHash.m_digest[3];
        hash.m_digest[4] = ON_SHA1_Hash::EmptyContentHash.m_digest[4];
        hash.m_digest[5] = ON_SHA1_Hash::EmptyContentHash.m_digest[5];
        hash.m_digest[6] = ON_SHA1_Hash::EmptyContentHash.m_digest[6];
        hash.m_digest[7] = ON_SHA1_Hash::EmptyContentHash.m_digest[7];
        hash.m_digest[0x10] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x10];
        hash.m_digest[0x11] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x11];
        hash.m_digest[0x12] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x12];
        hash.m_digest[0x13] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x13];
        ON_SubDimple::Internal_SetFragmentColorsSettingsHash((ON_SubDimple *)fragit._120_8_,hash);
        SetColorsMappingTag(this,&ON_MappingTag::Unset);
      }
      ON_SubDMeshFragmentIterator::~ON_SubDMeshFragmentIterator
                ((ON_SubDMeshFragmentIterator *)&frag);
      this_local._7_1_ = bVar1;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubD::SetFragmentColorsFromCallback(
  bool bLazySet,
  ON_SHA1_Hash fragment_colors_settings_hash,
  ON_MappingTag fragment_colors_mapping_tag,
  ON__UINT_PTR callback_context,
  const ON_Color(*color_callback)(
    ON__UINT_PTR callback_context,
    const ON_MappingTag& mapping_tag,
    const ON_SubD& subd,
    ON_SubDComponentPtr cptr, 
    const ON_3dPoint& P, 
    const ON_3dVector& N, 
    const ON_3dPoint& T, 
    const ON_SurfaceCurvature& K)
) const
{
  if (bLazySet
    && fragment_colors_settings_hash == FragmentColorsSettingsHash()
    && fragment_colors_mapping_tag == ColorsMappingTag()
    && this->HasFragmentColors()
    )
  {
    // This subd has fragments with per vertex colors.
    // The settings used to create those colors exactly
    // match the settings that color_callback() will use
    // to assign colors. The caller said to be lazy, so
    // assume the existing colors are correct and return.
    return true;
  }

  bool bFragmentVetexColorsSet = false;
  const ON_SubDimple* subdimple = this->SubDimple();
  if (nullptr != subdimple)
  {
    ON_SubDMeshFragmentIterator fragit(*this);
    for (const ON_SubDMeshFragment* frag = fragit.FirstFragment(); nullptr != frag; frag = fragit.NextFragment())
    {
      const bool b = frag->SetColorsFromCallback(
        fragment_colors_mapping_tag,
        *this,
        callback_context,
        color_callback
      );
      if (b)
      {
        bFragmentVetexColorsSet = true;
        frag->SetColorsExistForExperts(true);
      }
      else
        frag->SetColorsExistForExperts(false);
    }
    if (bFragmentVetexColorsSet)
    {
      subdimple->Internal_SetFragmentColorsSettingsHash(fragment_colors_settings_hash);
      SetColorsMappingTag(fragment_colors_mapping_tag);
      ChangeRenderContentSerialNumber();
    }
    else
    {
      subdimple->Internal_SetFragmentColorsSettingsHash(ON_SHA1_Hash::EmptyContentHash);
      this->SetColorsMappingTag(ON_MappingTag::Unset);
    }
  }

  return bFragmentVetexColorsSet;
}